

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

greatest_test_res zlib_zeroes(void)

{
  ulong local_128;
  size_t i;
  int res;
  uint dlen;
  uchar out [256];
  greatest_test_res local_c;
  
  i._4_4_ = 0x100;
  memset(&res,0xff,0x100);
  i._0_4_ = tinf_zlib_uncompress(&res,(uint *)((long)&i + 4),zlib_zeroes::data,0xc);
  greatest_info.assertions = greatest_info.assertions + 1;
  if (((int)i == 0) && (i._4_4_ == 0x100)) {
    for (local_128 = 0; local_128 < 0x100; local_128 = local_128 + 1) {
      if (*(char *)((long)&res + local_128) != '\0') {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
        greatest_info.fail_line = 0x266;
        greatest_info.msg = (char *)0x0;
        if ((greatest_info.flags & 4) == 0) {
          greatest_info.fail_line = 0x266;
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
          greatest_info.msg = (char *)0x0;
          return GREATEST_TEST_RES_FAIL;
        }
        abort();
      }
    }
    greatest_info.msg = (char *)0x0;
    local_c = GREATEST_TEST_RES_PASS;
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
    greatest_info.fail_line = 0x262;
    greatest_info.msg = "res == TINF_OK && dlen == ARRAY_SIZE(out)";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    local_c = GREATEST_TEST_RES_FAIL;
  }
  return local_c;
}

Assistant:

TEST zlib_zeroes(void)
{
	/* 256 zero bytes, to test unrolling in Adler-32 */
	static const unsigned char data[] = {
		0x78, 0x9C, 0x63, 0x60, 0x18, 0xD9, 0x00, 0x00, 0x01, 0x00,
		0x00, 0x01
	};
	unsigned char out[256];
	unsigned int dlen = ARRAY_SIZE(out);
	int res;
	size_t i;

	memset(out, 0xFF, ARRAY_SIZE(out));

	res = tinf_zlib_uncompress(out, &dlen, data, ARRAY_SIZE(data));

	ASSERT(res == TINF_OK && dlen == ARRAY_SIZE(out));

	for (i = 0; i < ARRAY_SIZE(out); ++i) {
		if (out[i]) {
			FAIL();
		}
	}

	PASS();
}